

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void gen_spr_sdr1(CPUPPCState_conflict2 *env)

{
  code *oea_read;
  code *oea_write;
  
  if (env->has_hv_mode == true) {
    oea_read = spr_noaccess;
    oea_write = spr_noaccess;
  }
  else {
    oea_read = spr_read_generic;
    oea_write = spr_write_sdr1;
  }
  _spr_register(env,0x19,"SDR1",spr_noaccess,spr_noaccess,oea_read,oea_write,spr_read_generic,
                spr_write_sdr1,0);
  return;
}

Assistant:

static void gen_spr_sdr1(CPUPPCState *env)
{
    if (env->has_hv_mode) {
        /*
         * SDR1 is a hypervisor resource on CPUs which have a
         * hypervisor mode
         */
        spr_register_hv(env, SPR_SDR1, "SDR1",
                        SPR_NOACCESS, SPR_NOACCESS,
                        SPR_NOACCESS, SPR_NOACCESS,
                        &spr_read_generic, &spr_write_sdr1,
                        0x00000000);
    } else {
        spr_register(env, SPR_SDR1, "SDR1",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_sdr1,
                     0x00000000);
    }
}